

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::ParameterizedTestSuiteInfo
          (ParameterizedTestSuiteInfo<UnsignedLongLong> *this,char *name,CodeLocation *code_location
          )

{
  CodeLocation *pCVar1;
  allocator local_21;
  CodeLocation *local_20;
  CodeLocation *code_location_local;
  char *name_local;
  ParameterizedTestSuiteInfo<UnsignedLongLong> *this_local;
  
  local_20 = code_location;
  code_location_local = (CodeLocation *)name;
  name_local = (char *)this;
  ParameterizedTestSuiteInfoBase::ParameterizedTestSuiteInfoBase
            (&this->super_ParameterizedTestSuiteInfoBase);
  pCVar1 = code_location_local;
  (this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase =
       (_func_int **)&PTR__ParameterizedTestSuiteInfo_003f30b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->test_suite_name_,(char *)pCVar1,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  CodeLocation::CodeLocation(&this->code_location_,code_location);
  std::
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>_>_>
  ::vector(&this->tests_);
  std::
  vector<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo>_>
  ::vector(&this->instantiations_);
  return;
}

Assistant:

explicit ParameterizedTestSuiteInfo(const char* name,
                                      CodeLocation code_location)
      : test_suite_name_(name), code_location_(code_location) {}